

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void slang::ast::LocalAssertionVarSymbol::fromSyntax
               (Scope *scope,LocalVariableDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *results)

{
  undefined1 *puVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  DeclaratorSyntax *decl;
  ValueSymbol *this;
  LocalAssertionVarSymbol *var;
  const_iterator __begin2;
  string_view local_70;
  iterator_base<const_slang::syntax::DeclaratorSyntax_*> local_60;
  ulong local_50;
  SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *local_48;
  Compilation *local_40;
  SourceLocation local_38;
  
  local_40 = scope->compilation;
  local_60.index = 0;
  local_50 = (syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1;
  local_60.list = &syntax->declarators;
  local_48 = results;
  for (; (local_60.list != &syntax->declarators || (local_60.index != local_50));
      local_60.index = local_60.index + 1) {
    decl = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
           iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&local_60);
    local_70 = parsing::Token::valueText(&decl->name);
    local_38 = parsing::Token::location(&decl->name);
    this = (ValueSymbol *)
           BumpAllocator::
           emplace<slang::ast::LocalAssertionVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&local_40->super_BumpAllocator,&local_70,&local_38);
    local_70._M_len = (size_t)this;
    (this->declaredType).typeOrLink = (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
    puVar1 = &(this->declaredType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    ValueSymbol::setFromDeclarator(this,decl);
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes((Symbol *)local_70._M_len,scope,syntax_00);
    SmallVectorBase<slang::ast::LocalAssertionVarSymbol_const*>::
    emplace_back<slang::ast::LocalAssertionVarSymbol_const*const&>
              ((SmallVectorBase<slang::ast::LocalAssertionVarSymbol_const*> *)local_48,
               (LocalAssertionVarSymbol **)&local_70);
    *(Scope **)(local_70._M_len + 0x20) = scope;
  }
  return;
}

Assistant:

void LocalAssertionVarSymbol::fromSyntax(const Scope& scope,
                                         const LocalVariableDeclarationSyntax& syntax,
                                         SmallVectorBase<const LocalAssertionVarSymbol*>& results) {
    auto& comp = scope.getCompilation();
    for (auto declarator : syntax.declarators) {
        auto var = comp.emplace<LocalAssertionVarSymbol>(declarator->name.valueText(),
                                                         declarator->name.location());
        var->setDeclaredType(*syntax.type);
        var->setFromDeclarator(*declarator);
        var->setAttributes(scope, syntax.attributes);
        results.push_back(var);

        // Local variables don't get added to any scope as members but
        // we still need a parent pointer set so they can participate in lookups.
        var->setParent(scope);
    }
}